

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::QFormLayoutPrivate(QFormLayoutPrivate *this)

{
  QLayoutPrivate *in_RDI;
  
  QLayoutPrivate::QLayoutPrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QFormLayoutPrivate_00d0d3d0;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xffffff00 | 0xff;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xffff00ff | 0xff00;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xfffcffff;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xfff3ffff | 0x40000;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xffcfffff | 0x100000;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xffbfffff;
  *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xff7fffff;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x4b202f);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x4b2040);
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::FixedColumnMatrix
            ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b2051);
  QList<QFormLayoutItem_*>::QList((QList<QFormLayoutItem_*> *)0x4b2062);
  *(undefined4 *)&in_RDI[1].field_0x40 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x44 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x48 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x4c = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x50 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x54 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x58 = 0xffffffff;
  *(undefined4 *)&in_RDI[1].field_0x5c = 0x7ffff;
  QSize::QSize((QSize *)in_RDI);
  QSize::QSize((QSize *)in_RDI);
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x4b20e5);
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x4b20f6);
  *(undefined4 *)(in_RDI + 2) = 0xffffffff;
  *(undefined4 *)&in_RDI[2].field_0x4 = 0xffffffff;
  return;
}

Assistant:

QFormLayoutPrivate::QFormLayoutPrivate()
    : fieldGrowthPolicy(DefaultFieldGrowthPolicy),
      rowWrapPolicy(DefaultRowWrapPolicy), has_hfw(false), dirty(true), sizesDirty(true),
      expandVertical(0), expandHorizontal(0)
{
}